

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBMPC.cpp
# Opt level: O0

bool FitTrackIBMPC(CylHead *cylhead,Track *track,int track_time_ms,FitDetails *details)

{
  DataRate datarate_00;
  Encoding encoding_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Sector *pSVar6;
  reference pvVar7;
  int *piVar8;
  LogHelper *pLVar9;
  int local_168;
  int local_f8;
  int total_size;
  int needed_length;
  int i_2;
  int unit_length;
  int i_1;
  Sector *s;
  int i;
  int iStack_70;
  bool all_errors;
  int max_size;
  int min_size;
  allocator<int> local_59;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> sizes;
  int sector_overhead;
  int track_space;
  Encoding encoding;
  DataRate datarate;
  FitDetails *details_local;
  int track_time_ms_local;
  Track *track_local;
  CylHead *cylhead_local;
  
  bVar1 = Track::empty(track);
  if ((bVar1) || (bVar1 = Track::is_mixed_encoding(track), bVar1)) {
    cylhead_local._7_1_ = false;
  }
  else {
    pSVar6 = Track::operator[](track,0);
    datarate_00 = pSVar6->datarate;
    pSVar6 = Track::operator[](track,0);
    encoding_00 = pSVar6->encoding;
    if ((encoding_00 == MFM) || (encoding_00 == FM)) {
      sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = GetTrackCapacity(track_time_ms,datarate_00,encoding_00);
      sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = GetSectorOverhead(encoding_00);
      iVar3 = Track::size(track);
      std::vector<int,_std::allocator<int>_>::resize(&details->sector_units,(long)iVar3);
      iVar3 = Track::size(track);
      std::allocator<int>::allocator(&local_59);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_58,(long)iVar3,&local_59);
      std::allocator<int>::~allocator(&local_59);
      details->real_errors = true;
      while( true ) {
        bVar1 = true;
        iStack_70 = 7;
        i = 0;
        for (s._4_4_ = 0; iVar3 = Track::size(track), s._4_4_ < iVar3; s._4_4_ = s._4_4_ + 1) {
          pSVar6 = Track::operator[](track,s._4_4_);
          if (((details->real_errors & 1U) != 0) || (bVar2 = Sector::has_good_data(pSVar6), bVar2))
          {
            iVar3 = Sector::SizeCodeToRealSizeCode((pSVar6->header).size);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_58,(long)s._4_4_);
            *pvVar7 = iVar3;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_58,(long)s._4_4_);
            piVar8 = std::min<int>(pvVar7,&stack0xffffffffffffff90);
            iStack_70 = *piVar8;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_58,(long)s._4_4_);
            piVar8 = std::max<int>(pvVar7,&i);
            i = *piVar8;
            bVar2 = Sector::has_good_data(pSVar6);
            bVar1 = (bVar1 & (bVar2 ^ 0xffU) & 1) != 0;
          }
          else {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_58,(long)s._4_4_);
            *pvVar7 = -1;
          }
        }
        if (bVar1 != false) {
          i = 7;
        }
        details->size_code = i;
        while (-1 < details->size_code) {
          details->total_units = 0;
          for (unit_length = 0; iVar3 = Track::size(track), unit_length < iVar3;
              unit_length = unit_length + 1) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_58,(long)unit_length);
            if ((*pvVar7 < 0) ||
               (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)local_58,(long)unit_length)
               , *pvVar7 < details->size_code)) {
              local_f8 = 1;
            }
            else {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_58,(long)unit_length);
              local_f8 = Sector::SizeCodeToLength(*pvVar7);
              iVar3 = Sector::SizeCodeToLength(details->size_code);
              local_f8 = local_f8 / iVar3;
            }
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&details->sector_units,(long)unit_length);
            *pvVar7 = local_f8;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&details->sector_units,(long)unit_length);
            details->total_units = *pvVar7 + details->total_units;
          }
          if (details->total_units != 0) {
            iVar3 = GetFormatGap(track_time_ms,datarate_00,encoding_00,details->total_units,
                                 details->size_code);
            details->gap3 = iVar3;
            if (details->gap3 != 0) {
              if ((opt.debug != 0) &&
                 ((iVar3 = details->total_units, iVar4 = Track::size(track), iVar3 != iVar4 ||
                  (opt.verbose != 0)))) {
                pLVar9 = util::operator<<((LogHelper *)&util::cout,(char (*) [11])"FitTrack: ");
                pLVar9 = util::operator<<(pLVar9,cylhead);
                pLVar9 = util::operator<<(pLVar9,(char (*) [12])" fits with ");
                pLVar9 = util::operator<<(pLVar9,&details->total_units);
                pLVar9 = util::operator<<(pLVar9,(char (*) [16])0x2a8b0b);
                pLVar9 = util::operator<<(pLVar9,&details->size_code);
                pLVar9 = util::operator<<(pLVar9,(char (*) [7])0x2a73eb);
                pLVar9 = util::operator<<(pLVar9,&details->gap3);
                util::operator<<(pLVar9,(char (*) [2])0x2a74b6);
              }
              cylhead_local._7_1_ = true;
              goto LAB_00219139;
            }
          }
          details->size_code = details->size_code + -1;
        }
        details->size_code = iStack_70;
        while (-1 < details->size_code) {
          details->gap3 = 0xff;
          while (iVar3 = (int)sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage, 0 < details->gap3) {
            iVar4 = Sector::SizeCodeToLength(details->size_code);
            iVar3 = iVar3 + iVar4 + details->gap3;
            details->total_units = 0;
            for (total_size = 0; iVar5 = Track::size(track),
                iVar4 = (int)sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage, total_size < iVar5;
                total_size = total_size + 1) {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_58,(long)total_size);
              if (*pvVar7 < 0) {
                local_168 = details->size_code;
              }
              else {
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)local_58,(long)total_size);
                local_168 = *pvVar7;
              }
              iVar5 = Sector::SizeCodeToLength(local_168);
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&details->sector_units,(long)total_size);
              *pvVar7 = (iVar4 + iVar5 + iVar3 + -1) / iVar3;
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&details->sector_units,(long)total_size);
              details->total_units = *pvVar7 + details->total_units;
            }
            iVar3 = GetFormatLength(encoding_00,details->total_units,details->size_code,
                                    details->gap3);
            if (iVar3 < sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_) {
              if (opt.debug != 0) {
                pLVar9 = util::operator<<((LogHelper *)&util::cout,(char (*) [11])"FitTrack: ");
                pLVar9 = util::operator<<(pLVar9,cylhead);
                pLVar9 = util::operator<<(pLVar9,(char (*) [12])" fits with ");
                pLVar9 = util::operator<<(pLVar9,&details->total_units);
                pLVar9 = util::operator<<(pLVar9,(char (*) [24])" clipped units of size=");
                pLVar9 = util::operator<<(pLVar9,&details->size_code);
                pLVar9 = util::operator<<(pLVar9,(char (*) [7])0x2a73eb);
                pLVar9 = util::operator<<(pLVar9,&details->gap3);
                util::operator<<(pLVar9,(char (*) [2])0x2a74b6);
              }
              cylhead_local._7_1_ = true;
              goto LAB_00219139;
            }
            details->gap3 = details->gap3 + -1;
          }
          details->size_code = details->size_code + -1;
        }
        if ((details->real_errors & 1U) == 0) break;
        details->real_errors = false;
      }
      if (opt.debug != 0) {
        pLVar9 = util::operator<<((LogHelper *)&util::cout,RED);
        pLVar9 = util::operator<<(pLVar9,(char (*) [25])"FitTrack: unable to fit ");
        pLVar9 = util::operator<<(pLVar9,cylhead);
        pLVar9 = util::operator<<(pLVar9,none);
        util::operator<<(pLVar9,(char (*) [2])0x2a74b6);
      }
      cylhead_local._7_1_ = false;
LAB_00219139:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58)
      ;
    }
    else {
      cylhead_local._7_1_ = false;
    }
  }
  return cylhead_local._7_1_;
}

Assistant:

bool FitTrackIBMPC(const CylHead& cylhead, const Track& track, int track_time_ms, FitDetails& details)
{
    if (track.empty() || track.is_mixed_encoding())
        return false;

    auto datarate = track[0].datarate;
    auto encoding = track[0].encoding;
    if (encoding != Encoding::MFM && encoding != Encoding::FM)
        return false;

    auto track_space = GetTrackCapacity(track_time_ms, datarate, encoding);
    auto sector_overhead = GetSectorOverhead(encoding);

    details.sector_units.resize(track.size());
    std::vector<int> sizes(track.size());
    int min_size, max_size;

    // Check both with real errors and dummy errors
    for (details.real_errors = true; ; details.real_errors = false)
    {
        bool all_errors = true;
        min_size = SIZE_MASK_765;
        max_size = 0;

        // Determine the largest and smallest true sector sizes.
        for (int i = 0; i < track.size(); ++i)
        {
            auto& s = track[i];

            if (!details.real_errors && !s.has_good_data())
                sizes[i] = -1;
            else
            {
                sizes[i] = Sector::SizeCodeToRealSizeCode(s.header.size);
                min_size = std::min(sizes[i], min_size);
                max_size = std::max(sizes[i], max_size);
                all_errors &= !s.has_good_data();
            }
        }

        // If all sectors are bad, consider the largest size that works.
        if (all_errors)
            max_size = SIZE_MASK_765;

        // Attempt to fit using simple size multiples, and either trusting or ignoring the size
        // of sectors that don't have a good data field.
        for (details.size_code = max_size; details.size_code >= 0; --details.size_code)
        {
            details.total_units = 0;
            for (int i = 0; i < track.size(); ++i)
            {
                details.sector_units[i] = (sizes[i] < 0 || sizes[i] < details.size_code) ? 1 :
                    (Sector::SizeCodeToLength(sizes[i]) / Sector::SizeCodeToLength(details.size_code));
                details.total_units += details.sector_units[i];
            }

            if (!details.total_units)
                continue;

            // Try standard format gaps, or calculate one that is suitable
            details.gap3 =
                GetFormatGap(track_time_ms, datarate, encoding, details.total_units, details.size_code);

            if (details.gap3)
            {
                // In debug, show the unit count wasn't obvious (unless forced)
                if (opt.debug && (details.total_units != track.size() || opt.verbose))
                    util::cout << "FitTrack: " << cylhead << " fits with " << details.total_units <<
                    " units of size=" << details.size_code << " gap3=" << details.gap3 << "\n";

                return true;
            }
        }

        // Attempt a more difficult fit using size and gap3 variations.
        for (details.size_code = min_size; details.size_code >= 0; --details.size_code)
        {
            for (details.gap3 = 255; details.gap3 > 0; --details.gap3)
            {
                auto unit_length =
                    sector_overhead + Sector::SizeCodeToLength(details.size_code) + details.gap3;

                details.total_units = 0;
                for (int i = 0; i < track.size(); ++i)
                {
                    auto needed_length = sector_overhead +
                        Sector::SizeCodeToLength(((sizes[i] < 0) ? details.size_code : sizes[i]));

                    details.sector_units[i] = (needed_length + unit_length - 1) / unit_length;
                    details.total_units += details.sector_units[i];
                }

                auto total_size =
                    GetFormatLength(encoding, details.total_units, details.size_code, details.gap3);
                if (total_size < track_space)
                {
                    if (opt.debug)
                        util::cout << "FitTrack: " << cylhead << " fits with " <<
                        details.total_units << " clipped units of size=" << details.size_code <<
                        " gap3=" << details.gap3 << "\n";
                    return true;
                }
            }
        }

        if (!details.real_errors)
            break;
    }

    if (opt.debug)
        util::cout << colour::RED << "FitTrack: unable to fit " << cylhead << colour::none << "\n";

    return false;
}